

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O3

void __thiscall
ctemplate::SectionTemplateNode::WriteHeaderEntries
          (SectionTemplateNode *this,string *outstring,string *filename)

{
  char *pcVar1;
  _List_node_base *p_Var2;
  string local_48;
  
  pcVar1 = (this->token_).text;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar1,pcVar1 + (this->token_).textlen);
  anon_unknown_14::WriteOneHeaderEntry(outstring,&local_48,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  for (p_Var2 = (this->node_list_).
                super__List_base<ctemplate::TemplateNode_*,_std::allocator<ctemplate::TemplateNode_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 != (_List_node_base *)&this->node_list_; p_Var2 = p_Var2->_M_next) {
    (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 0x18))(p_Var2[1]._M_next,outstring,filename);
  }
  return;
}

Assistant:

void SectionTemplateNode::WriteHeaderEntries(string *outstring,
                                             const string& filename) const {
  WriteOneHeaderEntry(outstring, string(token_.text, token_.textlen),
                      filename);

  NodeList::const_iterator iter = node_list_.begin();
  for (; iter != node_list_.end(); ++iter) {
    (*iter)->WriteHeaderEntries(outstring, filename);
  }
}